

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18dr1.cpp
# Opt level: O2

int main(void)

{
  uint32_t uVar1;
  long lVar2;
  int aa [10];
  
  f(ga,10);
  lVar2 = 0;
  while (lVar2 != 10) {
    uVar1 = fact((uint32_t)(lVar2 + 1));
    aa[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  }
  f(aa,10);
  return 0;
}

Assistant:

int main() { 
    constexpr uint32_t size = 10;
    f(ga, size);
    int aa[size];
    for (size_t count = 0; count < size; count++) {
        aa[count] = fact(count + 1);
    }
    f(aa, size);
}